

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raassignment_p.h
# Opt level: O2

int __thiscall
asmjit::RAAssignment::verify
          (RAAssignment *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  ulong uVar1;
  RAWorkReg **ppRVar2;
  byte *pbVar3;
  ulong uVar4;
  long lVar5;
  
  for (uVar4 = 0; uVar1 = (ulong)(this->_layout).workCount, uVar4 < uVar1; uVar4 = uVar4 + 1) {
    uVar1 = (ulong)this->_workToPhysMap[uVar4].physIds[0];
    if (uVar1 != 0xff) {
      ppRVar2 = ZoneVector<asmjit::RAWorkReg_*>::at((this->_layout).workRegs,uVar4);
      if (uVar4 != *(uint *)(*(long *)((long)this->_physToWorkIds +
                                      (ulong)(((*ppRVar2)->_info)._signature >> 5 & 0x78)) +
                            uVar1 * 4)) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/../core/../core/raassignment_p.h"
                   ,0x179,"_physToWorkIds[group][physId] == workId");
      }
    }
  }
  lVar5 = 0;
  do {
    if (lVar5 == 4) {
      return (int)uVar1;
    }
    pbVar3 = RARegCount::operator[](&(this->_layout).physCount,(uint32_t)lVar5);
    uVar1 = (ulong)*pbVar3;
    for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      if (((ulong)this->_physToWorkIds[lVar5][uVar4] != 0xffffffff) &&
         (uVar4 != this->_workToPhysMap[this->_physToWorkIds[lVar5][uVar4]].physIds[0])) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/../core/../core/raassignment_p.h"
                   ,0x185,"_workToPhysMap->physIds[workId] == physId");
      }
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

ASMJIT_NOINLINE void verify() noexcept {
    // Verify WorkToPhysMap.
    {
      for (uint32_t workId = 0; workId < _layout.workCount; workId++) {
        uint32_t physId = _workToPhysMap->physIds[workId];
        if (physId != kPhysNone) {
          const RAWorkReg* workReg = _layout.workRegs->at(workId);
          uint32_t group = workReg->group();
          ASMJIT_ASSERT(_physToWorkIds[group][physId] == workId);
        }
      }
    }

    // Verify PhysToWorkMap.
    {
      for (uint32_t group = 0; group < BaseReg::kGroupVirt; group++) {
        uint32_t physCount = _layout.physCount[group];
        for (uint32_t physId = 0; physId < physCount; physId++) {
          uint32_t workId = _physToWorkIds[group][physId];
          if (workId != kWorkNone) {
            ASMJIT_ASSERT(_workToPhysMap->physIds[workId] == physId);
          }
        }
      }
    }
  }